

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_var.h
# Opt level: O1

void var_act_bump(solver_t *s,uint var)

{
  uint uVar1;
  vec_act_t *pvVar2;
  sdbl_t *psVar3;
  vec_int_t *pvVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  pvVar2 = s->activity;
  if (pvVar2 == (vec_act_t *)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/satoko/utils/vec/vec_sdbl.h"
                  ,0x91,"sdbl_t *vec_sdbl_data(vec_sdbl_t *)");
  }
  psVar3 = pvVar2->data;
  uVar5 = psVar3[var];
  uVar7 = s->var_act_inc;
  uVar6 = uVar7;
  if (uVar5 >= uVar7 && uVar5 != uVar7) {
    uVar6 = uVar5;
  }
  if (uVar5 < uVar7) {
    uVar7 = uVar5;
  }
  uVar8 = ((uVar7 & 0xffffffffffff) >> ((char)(uVar6 >> 0x30) - (char)(uVar7 >> 0x30) & 0x3fU)) +
          (uVar6 & 0xffffffffffff);
  uVar7 = (uVar6 >> 0x30) + (uVar8 >> 0x30);
  uVar5 = 0xffffffffffffffff;
  if (uVar7 < 0x10000) {
    uVar5 = (uVar7 << 0x30) + (uVar8 >> ((byte)(uVar8 >> 0x30) & 0x3f));
  }
  psVar3[var] = uVar5;
  if ((s->opts).var_act_limit < uVar5) {
    uVar1 = pvVar2->size;
    if ((ulong)uVar1 != 0) {
      uVar5 = (ulong)(s->opts).var_act_rescale;
      uVar7 = 0;
      do {
        uVar8 = psVar3[uVar7] >> 0x30;
        uVar6 = psVar3[uVar7] & 0xffffffffffff | uVar8 - uVar5 << 0x30;
        if (uVar8 < uVar5) {
          uVar6 = 0x800000000000;
        }
        psVar3[uVar7] = uVar6;
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
    uVar6 = (ulong)(s->opts).var_act_rescale;
    uVar7 = s->var_act_inc >> 0x30;
    uVar5 = s->var_act_inc & 0xffffffffffff | uVar7 - uVar6 << 0x30;
    if (uVar7 < uVar6) {
      uVar5 = 0x800000000000;
    }
    s->var_act_inc = uVar5;
  }
  pvVar4 = s->var_order->indices;
  if ((var < pvVar4->size) && (-1 < pvVar4->data[var])) {
    if ((var < pvVar4->size) && (-1 < pvVar4->data[var])) {
      heap_percolate_up(s->var_order,pvVar4->data[var]);
      return;
    }
    __assert_fail("heap_in_heap(p, entry)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/satoko/utils/heap.h"
                  ,0x71,"void heap_decrease(heap_t *, unsigned int)");
  }
  return;
}

Assistant:

static inline void var_act_bump(solver_t *s, unsigned var)
{
    act_t *activity = vec_act_data(s->activity);

    activity[var] = sdbl_add(activity[var], s->var_act_inc);
    if (activity[var] > s->opts.var_act_limit)
        var_act_rescale(s);
    if (heap_in_heap(s->var_order, var))
        heap_decrease(s->var_order, var);
}